

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall QTreeWidgetItem::removeChild(QTreeWidgetItem *this,QTreeWidgetItem *child)

{
  long *plVar1;
  long lVar2;
  int index;
  long lVar3;
  
  lVar2 = (this->children).d.size;
  if (lVar2 == 0) {
LAB_005b169b:
    index = -1;
  }
  else {
    index = -1;
    lVar3 = 0;
    do {
      if (lVar2 << 3 == lVar3) goto LAB_005b169b;
      index = index + 1;
      plVar1 = (long *)((long)(this->children).d.ptr + lVar3);
      lVar3 = lVar3 + 8;
    } while ((QTreeWidgetItem *)*plVar1 != child);
  }
  takeChild(this,index);
  return;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }